

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionController_AddPegoutTxOut2_Test *this)

{
  bool bVar1;
  Amount *pAVar2;
  char *pcVar3;
  undefined1 uVar4;
  Amount AVar5;
  AssertionResult gtest_ar;
  ConfidentialTransactionController txc;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffff49c;
  Address *in_stack_fffffffffffff4a0;
  Address *pAVar7;
  undefined8 in_stack_fffffffffffff4a8;
  ConfidentialTransactionController *in_stack_fffffffffffff4b0;
  uint32_t in_stack_fffffffffffff4b8;
  undefined4 uVar8;
  uint32_t in_stack_fffffffffffff4bc;
  Txid *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffff4cc;
  undefined7 in_stack_fffffffffffff540;
  ConfidentialTransactionController *this_00;
  AssertHelper local_aa0;
  Message local_a98;
  string local_a90 [32];
  AssertionResult local_a70;
  allocator local_a59;
  string local_a58;
  ConfidentialAssetId local_a38;
  int64_t local_a10;
  undefined1 local_a08;
  int64_t local_a00;
  undefined1 local_9f8;
  ByteData local_8f8;
  allocator local_8d9;
  string local_8d8 [32];
  Privkey local_8b8;
  Pubkey local_898;
  allocator local_879;
  string local_878 [4];
  Address *in_stack_fffffffffffff808;
  pointer in_stack_fffffffffffff810;
  pointer in_stack_fffffffffffff818;
  pointer in_stack_fffffffffffff820;
  ConfidentialTransactionController *in_stack_fffffffffffff828;
  NetType in_stack_fffffffffffff840;
  pointer in_stack_fffffffffffff848;
  pointer in_stack_fffffffffffff850;
  string *in_stack_fffffffffffff858;
  uint32_t in_stack_fffffffffffff860;
  ByteData *in_stack_fffffffffffff868;
  NetType in_stack_fffffffffffff870;
  Address *in_stack_fffffffffffff878;
  allocator local_6d9;
  string local_6d8;
  BlockHash local_6b8;
  allocator local_691;
  string local_690;
  ConfidentialAssetId local_670;
  int64_t local_648;
  undefined1 local_640;
  int64_t local_638;
  undefined1 local_630;
  allocator local_529;
  string local_528;
  ConfidentialAssetId local_508;
  Amount *local_4e0;
  undefined1 local_4d8;
  Amount *local_4d0;
  undefined1 local_4c8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_4c0;
  Address local_4a1;
  ConfidentialTransactionController local_1f9 [6];
  
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (in_stack_fffffffffffff4b0,(uint32_t)((ulong)in_stack_fffffffffffff4a8 >> 0x20),
             (uint32_t)in_stack_fffffffffffff4a8);
  this_00 = local_1f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)
             ((long)&local_1f9[0].super_AbstractTransactionController.
                     _vptr_AbstractTransactionController + 1),
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",(allocator *)this_00
            );
  cfd::core::Txid::Txid
            ((Txid *)((long)&local_1f9[0].transaction_.vin_.
                             super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1),
             (string *)
             ((long)&local_1f9[0].super_AbstractTransactionController.
                     _vptr_AbstractTransactionController + 1));
  cfd::ConfidentialTransactionController::AddTxIn
            ((ConfidentialTransactionController *)
             CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),in_stack_fffffffffffff4c0
             ,in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)in_stack_fffffffffffff4a0);
  cfd::core::Txid::~Txid((Txid *)0x20effe);
  std::__cxx11::string::~string
            ((string *)
             ((long)&local_1f9[0].super_AbstractTransactionController.
                     _vptr_AbstractTransactionController + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1f9);
  pAVar7 = &local_4a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)&local_4a1.type_ + 1),"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",
             (allocator *)pAVar7);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)((long)local_4a1.address_.field_2._M_local_buf + 1),
             (string *)((long)&local_4a1.type_ + 1),&local_4c0);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  pAVar2 = (Amount *)AVar5.amount_;
  uVar4 = AVar5.ignore_check_;
  local_4e0 = pAVar2;
  local_4d8 = uVar4;
  local_4d0 = pAVar2;
  local_4c8 = uVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_528,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_529);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_508,&local_528);
  cfd::ConfidentialTransactionController::AddTxOut
            (this_00,pAVar7,pAVar2,(ConfidentialAssetId *)CONCAT17(uVar4,in_stack_fffffffffffff540))
  ;
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)in_stack_fffffffffffff4a0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20f168);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  cfd::core::Address::~Address(in_stack_fffffffffffff4a0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff4b0);
  std::__cxx11::string::~string((string *)((long)&local_4a1.type_ + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_648 = AVar5.amount_;
  local_640 = AVar5.ignore_check_;
  local_638 = local_648;
  local_630 = local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_690,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_691);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_670,&local_690);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6d8,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"
             ,&local_6d9);
  cfd::core::BlockHash::BlockHash(&local_6b8,&local_6d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_878,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",&local_879)
  ;
  cfd::core::Address::Address((Address *)(local_878 + 1),local_878);
  cfd::core::Pubkey::Pubkey(&local_898);
  cfd::core::Privkey::Privkey(&local_8b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"",&local_8d9);
  cfd::core::ByteData::ByteData(&local_8f8);
  pAVar2 = (Amount *)&local_8f8;
  pAVar7 = (Address *)&local_898;
  uVar9 = 3;
  uVar8 = 0;
  uVar6 = 0;
  cfd::ConfidentialTransactionController::AddPegoutTxOut
            (in_stack_fffffffffffff828,(Amount *)in_stack_fffffffffffff820,
             (ConfidentialAssetId *)in_stack_fffffffffffff818,(BlockHash *)in_stack_fffffffffffff810
             ,in_stack_fffffffffffff808,in_stack_fffffffffffff840,
             (Pubkey *)in_stack_fffffffffffff848,(Privkey *)in_stack_fffffffffffff850,
             in_stack_fffffffffffff858,in_stack_fffffffffffff860,in_stack_fffffffffffff868,
             in_stack_fffffffffffff870,in_stack_fffffffffffff878);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)pAVar7);
  cfd::core::ByteData::~ByteData((ByteData *)0x20f3e4);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  cfd::core::Privkey::~Privkey((Privkey *)0x20f40b);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x20f418);
  cfd::core::Address::~Address(pAVar7);
  std::__cxx11::string::~string((string *)local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x20f44c);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20f473);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  AVar5 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_a10 = AVar5.amount_;
  local_a08 = AVar5.ignore_check_;
  local_a00 = local_a10;
  local_9f8 = local_a08;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a58,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_a59);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_a38,&local_a58);
  cfd::ConfidentialTransactionController::AddTxOutFee
            ((ConfidentialTransactionController *)CONCAT44(in_stack_fffffffffffff4cc,uVar9),pAVar2,
             (ConfidentialAssetId *)CONCAT44(in_stack_fffffffffffff4bc,uVar8));
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)pAVar7);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x20f55d);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator((allocator<char> *)&local_a59);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((AbstractTransactionController *)CONCAT44(in_stack_fffffffffffff49c,uVar6));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a70,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar3,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string(local_a90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a70);
  if (!bVar1) {
    testing::Message::Message(&local_a98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x20fa01);
    testing::internal::AssertHelper::AssertHelper
              (&local_aa0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=(&local_aa0,&local_a98);
    testing::internal::AssertHelper::~AssertHelper(&local_aa0);
    testing::Message::~Message((Message *)0x20fa5e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x20fab3);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)pAVar7);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut2)
{
    ConfidentialTransactionController txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}